

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O2

uint32 __thiscall
Js::ByteCodeBufferBuilder::AddAsmJsModuleInfo
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,FunctionBody *function)

{
  Type value;
  PropertyIdArray *pPVar1;
  BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar2;
  bool bVar3;
  uint32 uVar4;
  uint32 uVar5;
  uint32 uVar6;
  int iVar7;
  uint32 uVar8;
  PropertyId PVar9;
  AsmJsModuleInfo *this_00;
  ModuleVar *value_00;
  ModuleVarImport *pMVar10;
  ModuleFunctionImport *pMVar11;
  ModuleFunction *pMVar12;
  ModuleFunctionTable *pMVar13;
  EntryType *pEVar14;
  int i_1;
  int iVar15;
  uint i;
  ulong uVar16;
  undefined1 local_80 [8];
  EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  slotIter;
  
  this_00 = FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)3,Js::AsmJsModuleInfo*>
                      ((FunctionProxy *)function);
  iVar15 = 0;
  uVar4 = PrependInt32(this,builder,L"ArgInCount",this_00->mArgInCount,(BufferBuilderInt32 **)0x0);
  uVar5 = PrependInt32(this,builder,L"ExportsCount",this_00->mExportsCount,
                       (BufferBuilderInt32 **)0x0);
  uVar6 = PrependInt32(this,builder,L"SlotsCount",this_00->mSlotsCount,(BufferBuilderInt32 **)0x0);
  iVar7 = uVar6 + uVar5 + uVar4;
  if (0 < this_00->mExportsCount) {
    pPVar1 = (this_00->mExports).ptr;
    uVar4 = PrependByte(this,builder,L"ExtraSlotsCount",pPVar1->extraSlots);
    uVar5 = PrependByte(this,builder,L"ExportsIdArrayDups",pPVar1->hadDuplicates);
    uVar6 = PrependByte(this,builder,L"ExportsIdArray__proto__",pPVar1->has__proto__);
    uVar8 = PrependInt32(this,builder,L"ExportsIdArrayLength",pPVar1->count,
                         (BufferBuilderInt32 **)0x0);
    iVar7 = uVar8 + uVar6 + uVar5 + uVar4 + iVar7;
    for (uVar16 = 0; uVar16 < pPVar1->count; uVar16 = uVar16 + 1) {
      PVar9 = encodePossiblyBuiltInPropertyId(this,(&pPVar1[1].count)[uVar16]);
      uVar4 = PrependInt32(this,builder,L"ExportsIdArrayElem",PVar9,(BufferBuilderInt32 **)0x0);
      iVar7 = iVar7 + uVar4;
    }
    uVar4 = PrependUInt32Array(this,builder,this_00->mExportsCount,
                               (this_00->mExportsFunctionLocation).ptr);
    iVar7 = uVar4 + iVar7;
  }
  uVar4 = PrependInt32(this,builder,L"ExportFunctionIndex",this_00->mExportFunctionIndex,
                       (BufferBuilderInt32 **)0x0);
  uVar5 = PrependInt32(this,builder,L"VarCount",this_00->mVarCount,(BufferBuilderInt32 **)0x0);
  iVar7 = uVar5 + uVar4 + iVar7;
  for (; iVar15 < this_00->mVarCount; iVar15 = iVar15 + 1) {
    value_00 = AsmJsModuleInfo::GetVar(this_00,iVar15);
    uVar4 = PrependStruct<Js::AsmJsModuleInfo::ModuleVar>(this,builder,L"ModuleVar",value_00);
    iVar7 = iVar7 + uVar4;
  }
  uVar4 = PrependInt32(this,builder,L"VarImportCount",this_00->mVarImportCount,
                       (BufferBuilderInt32 **)0x0);
  iVar7 = uVar4 + iVar7;
  for (iVar15 = 0; iVar15 < this_00->mVarImportCount; iVar15 = iVar15 + 1) {
    pMVar10 = AsmJsModuleInfo::GetVarImport(this_00,iVar15);
    value = pMVar10->type;
    PVar9 = pMVar10->field;
    uVar4 = PrependInt32(this,builder,L"ImportLocation",pMVar10->location,(BufferBuilderInt32 **)0x0
                        );
    uVar5 = PrependByte(this,builder,L"ImportType",value);
    PVar9 = encodePossiblyBuiltInPropertyId(this,PVar9);
    uVar6 = PrependInt32(this,builder,L"ImportId",PVar9,(BufferBuilderInt32 **)0x0);
    iVar7 = uVar6 + uVar5 + uVar4 + iVar7;
  }
  uVar4 = PrependInt32(this,builder,L"FunctionImportCount",this_00->mFunctionImportCount,
                       (BufferBuilderInt32 **)0x0);
  iVar7 = uVar4 + iVar7;
  for (iVar15 = 0; iVar15 < this_00->mFunctionImportCount; iVar15 = iVar15 + 1) {
    pMVar11 = AsmJsModuleInfo::GetFunctionImport(this_00,iVar15);
    PVar9 = pMVar11->field;
    uVar4 = PrependInt32(this,builder,L"ImportLocation",pMVar11->location,(BufferBuilderInt32 **)0x0
                        );
    PVar9 = encodePossiblyBuiltInPropertyId(this,PVar9);
    uVar5 = PrependInt32(this,builder,L"ImportId",PVar9,(BufferBuilderInt32 **)0x0);
    iVar7 = uVar5 + uVar4 + iVar7;
  }
  uVar4 = PrependInt32(this,builder,L"FunctionCount",this_00->mFunctionCount,
                       (BufferBuilderInt32 **)0x0);
  iVar7 = uVar4 + iVar7;
  for (iVar15 = 0; iVar15 < this_00->mFunctionCount; iVar15 = iVar15 + 1) {
    pMVar12 = AsmJsModuleInfo::GetFunction(this_00,iVar15);
    uVar4 = PrependInt32(this,builder,L"FuncLocation",pMVar12->location,(BufferBuilderInt32 **)0x0);
    iVar7 = iVar7 + uVar4;
  }
  uVar4 = PrependInt32(this,builder,L"FunctionTableCount",this_00->mFunctionTableCount,
                       (BufferBuilderInt32 **)0x0);
  iVar7 = uVar4 + iVar7;
  for (iVar15 = 0; iVar15 < this_00->mFunctionTableCount; iVar15 = iVar15 + 1) {
    pMVar13 = AsmJsModuleInfo::GetFunctionTable(this_00,iVar15);
    AsmJsModuleInfo::ModuleFunctionTable::ModuleFunctionTable
              ((ModuleFunctionTable *)local_80,pMVar13);
    uVar4 = PrependInt32(this,builder,L"FuncTableSize",local_80._0_4_,(BufferBuilderInt32 **)0x0);
    iVar7 = iVar7 + uVar4;
    PrependUInt32Array(this,builder,local_80._0_4_,
                       (uint32 *)
                       slotIter.
                       super_IteratorBase<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                       .entries);
  }
  uVar4 = PrependStruct<Js::AsmJsModuleMemory>(this,builder,L"ModuleMemory",&this_00->mModuleMemory)
  ;
  pBVar2 = (this_00->mSlotMap).ptr;
  uVar5 = PrependInt32(this,builder,L"AsmJsSlotMapCount",pBVar2->count - pBVar2->freeCount,
                       (BufferBuilderInt32 **)0x0);
  iVar7 = uVar5 + uVar4 + iVar7;
  JsUtil::
  BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::
  EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  ::EntryIterator((EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                   *)local_80,(this_00->mSlotMap).ptr);
  while (bVar3 = JsUtil::
                 BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 ::
                 EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                 ::IsValid((EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                            *)local_80), bVar3) {
    iVar15 = JsUtil::
             BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             ::
             IteratorBase<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
             ::CurrentKey((IteratorBase<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                           *)local_80);
    PVar9 = encodePossiblyBuiltInPropertyId(this,iVar15);
    uVar4 = PrependInt32(this,builder,L"AsmJsSlotPropId",PVar9,(BufferBuilderInt32 **)0x0);
    pEVar14 = JsUtil::
              BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::
              IteratorBase<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
              ::Current((IteratorBase<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                         *)local_80);
    uVar5 = PrependStruct<Js::AsmJsSlot>
                      (this,builder,L"AsmJsSlotValue",
                       (pEVar14->
                       super_DefaultHashedEntry<int,_Memory::WriteBarrierPtr<Js::AsmJsSlot>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                       ).super_KeyValueEntry<int,_Memory::WriteBarrierPtr<Js::AsmJsSlot>_>.
                       super_ValueEntry<Memory::WriteBarrierPtr<Js::AsmJsSlot>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_Memory::WriteBarrierPtr<Js::AsmJsSlot>_>_>
                       .super_KeyValueEntryDataLayout2<int,_Memory::WriteBarrierPtr<Js::AsmJsSlot>_>
                       .value.ptr);
    iVar7 = uVar5 + uVar4 + iVar7;
    JsUtil::
    BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::
    EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
    ::MoveNext((EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                *)local_80);
  }
  slotIter.
  super_IteratorBase<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
  ._24_8_ = (this_00->mAsmMathBuiltinUsed).data[0].word;
  uVar4 = PrependStruct<BVStatic<32ul>>
                    (this,builder,L"MathBuiltinBV",
                     (BVStatic<32UL> *)
                     &slotIter.
                      super_IteratorBase<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                      .usedEntryCount);
  slotIter.
  super_IteratorBase<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
  ._24_8_ = (this_00->mAsmArrayBuiltinUsed).data[0].word;
  uVar5 = PrependStruct<BVStatic<16ul>>
                    (this,builder,L"ArrayBuiltinBV",
                     (BVStatic<16UL> *)
                     &slotIter.
                      super_IteratorBase<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                      .usedEntryCount);
  uVar6 = PrependInt32(this,builder,L"MaxHeapAccess",this_00->mMaxHeapAccess,
                       (BufferBuilderInt32 **)0x0);
  return uVar6 + uVar5 + uVar4 + iVar7;
}

Assistant:

uint32 AddAsmJsModuleInfo(BufferBuilderList & builder, FunctionBody * function)
    {
        uint32 size = 0;
        AsmJsModuleInfo * moduleInfo = function->GetAsmJsModuleInfo();

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        PrependInt32(builder, _u("Start Asm.js Module Info"), magicStartOfAsmJsModuleInfo);
#endif

        size += PrependInt32(builder, _u("ArgInCount"), moduleInfo->GetArgInCount());
        size += PrependInt32(builder, _u("ExportsCount"), moduleInfo->GetExportsCount());
        size += PrependInt32(builder, _u("SlotsCount"), moduleInfo->GetSlotsCount());

        if (moduleInfo->GetExportsCount() > 0)
        {
            PropertyIdArray * propArray = moduleInfo->GetExportsIdArray();
            size += PrependByte(builder, _u("ExtraSlotsCount"), propArray->extraSlots);
            size += PrependByte(builder, _u("ExportsIdArrayDups"), propArray->hadDuplicates);
            size += PrependByte(builder, _u("ExportsIdArray__proto__"), propArray->has__proto__);
            size += PrependInt32(builder, _u("ExportsIdArrayLength"), propArray->count);
            for (uint i = 0; i < propArray->count; i++)
            {
                PropertyId propertyId = encodePossiblyBuiltInPropertyId(propArray->elements[i]);
                size += PrependInt32(builder, _u("ExportsIdArrayElem"), propertyId);
            }
            size += PrependUInt32Array(builder, moduleInfo->GetExportsCount(), moduleInfo->GetExportsFunctionLocation());
        }

        size += PrependInt32(builder, _u("ExportFunctionIndex"), moduleInfo->GetExportFunctionIndex());

        size += PrependInt32(builder, _u("VarCount"), moduleInfo->GetVarCount());
        for (int i = 0; i < moduleInfo->GetVarCount(); i++)
        {
            size += PrependStruct(builder, _u("ModuleVar"), &moduleInfo->GetVar(i));
        }

        size += PrependInt32(builder, _u("VarImportCount"), moduleInfo->GetVarImportCount());
        for (int i = 0; i < moduleInfo->GetVarImportCount(); i++)
        {
            auto import = moduleInfo->GetVarImport(i);
            size += PrependInt32(builder, _u("ImportLocation"), import.location);
            size += PrependByte(builder, _u("ImportType"), import.type);
            PropertyId propertyId = encodePossiblyBuiltInPropertyId(import.field);
            size += PrependInt32(builder, _u("ImportId"), propertyId);
        }

        size += PrependInt32(builder, _u("FunctionImportCount"), moduleInfo->GetFunctionImportCount());
        for (int i = 0; i < moduleInfo->GetFunctionImportCount(); i++)
        {
            auto import = moduleInfo->GetFunctionImport(i);
            size += PrependInt32(builder, _u("ImportLocation"), import.location);
            PropertyId propertyId = encodePossiblyBuiltInPropertyId(import.field);
            size += PrependInt32(builder, _u("ImportId"), propertyId);
        }

        size += PrependInt32(builder, _u("FunctionCount"), moduleInfo->GetFunctionCount());
        for (int i = 0; i < moduleInfo->GetFunctionCount(); i++)
        {
            auto func = moduleInfo->GetFunction(i);
            size += PrependInt32(builder, _u("FuncLocation"), func.location);
        }

        size += PrependInt32(builder, _u("FunctionTableCount"), moduleInfo->GetFunctionTableCount());
        for (int i = 0; i < moduleInfo->GetFunctionTableCount(); i++)
        {
            auto table = moduleInfo->GetFunctionTable(i);
            size += PrependInt32(builder, _u("FuncTableSize"), table.size);
            PrependUInt32Array(builder, table.size, table.moduleFunctionIndex);
        }

        size += PrependStruct<AsmJsModuleMemory>(builder, _u("ModuleMemory"), &moduleInfo->GetModuleMemory());

        size += PrependInt32(builder, _u("AsmJsSlotMapCount"), moduleInfo->GetAsmJsSlotMap()->Count());
        auto slotIter = moduleInfo->GetAsmJsSlotMap()->GetIterator();
        while (slotIter.IsValid())
        {
            PropertyId propertyId = encodePossiblyBuiltInPropertyId(slotIter.CurrentKey());
            size += PrependInt32(builder, _u("AsmJsSlotPropId"), propertyId);
            size += PrependStruct(builder, _u("AsmJsSlotValue"), slotIter.CurrentValue());
            slotIter.MoveNext();
        }
        size += PrependStruct(builder, _u("MathBuiltinBV"), &moduleInfo->GetAsmMathBuiltinUsed());
        size += PrependStruct(builder, _u("ArrayBuiltinBV"), &moduleInfo->GetAsmArrayBuiltinUsed());

        size += PrependInt32(builder, _u("MaxHeapAccess"), moduleInfo->GetMaxHeapAccess());

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        size += PrependInt32(builder, _u("End Asm.js Module Info"), magicEndOfAsmJsModuleInfo);
#endif
        return size;
    }